

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  undefined1 *puVar1;
  _Manager_type p_Var2;
  pointer pSVar3;
  pointer poVar4;
  ulong uVar5;
  bool bVar6;
  size_type __n;
  long lVar7;
  KeyValue<supermap::Key<30UL>,_unsigned_long> *pKVar8;
  KeyValue<supermap::Key<30UL>,_unsigned_long> *pKVar9;
  uint i;
  long lVar10;
  ulong uVar11;
  size_type sVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  ulong local_130;
  unsigned_long batchSize_local;
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  frontLine;
  KeyValue<supermap::Key<30UL>,_unsigned_long> minItem;
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  writeBuffer;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type local_a0;
  ulong local_98;
  anon_class_24_3_7a9e0d2b updateOnce;
  shared_ptr<supermap::io::FileManager> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  
  batchSize_local = batchSize;
  std::filesystem::__cxx11::path::path((path *)&minItem,dataFileName,auto_format);
  local_78.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_78.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (_Manager_type)0x0;
  local_a0 = registerSupplier->_M_invoker;
  p_Var2 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_b8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_b8._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_a8 = p_Var2;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ::SingleFileIndexedStorage
            (&this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
             ,(path *)&minItem,&local_78,(InnerRegisterSupplier *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&minItem);
  (this->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ).
  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00124f60;
  (this->
  super_Findable<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::Key<30UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00124fa8;
  __n = ((long)(newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(newer->
              super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&currentFrontPointers,__n,(allocator_type *)&minItem);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  ::vector(&frontLine,__n,(value_type *)&minItem,(allocator_type *)&updateOnce);
  lVar15 = 0x28;
  lVar14 = 0;
  lVar10 = 0;
  sVar12 = __n;
  while (bVar16 = sVar12 != 0, sVar12 = sVar12 - 1, bVar16) {
    pSVar3 = (newer->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (**(code **)(*(long *)((long)&(pSVar3->
                                          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                          ).
                                          super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                          .
                                          super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                          ._vptr_OrderedStorage + lVar14) + 8))
                      ((long)&(pSVar3->
                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                              ).
                              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                              .
                              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                              ._vptr_OrderedStorage + lVar14);
    poVar4 = frontLine.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar7 != 0) {
      pSVar3 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(*(long *)((long)&(pSVar3->
                                    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                    ).
                                    super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                    .
                                    super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                    ._vptr_OrderedStorage + lVar14) + 0x20))
                (&minItem,(long)&(pSVar3->
                                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 ).
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 .
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 ._vptr_OrderedStorage + lVar14,0);
      if (*(char *)((long)&(poVar4->
                           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                           ._M_payload + lVar15) == '\x01') {
        *(undefined1 *)
         ((long)&(poVar4->
                 super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                 ._M_payload + lVar15) = 0;
      }
      puVar1 = (undefined1 *)
               ((long)&(poVar4->
                       super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                       )._M_payload.
                       super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                       ._M_payload + lVar15);
      *(unsigned_long *)(puVar1 + -8) = minItem.value;
      *(undefined4 *)(puVar1 + -0x18) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._16_4_
      ;
      *(undefined4 *)(puVar1 + -0x14) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._20_4_
      ;
      *(undefined4 *)(puVar1 + -0x10) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._24_4_
      ;
      *(undefined4 *)(puVar1 + -0xc) = minItem._28_4_;
      *(undefined4 *)(puVar1 + -0x28) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._0_4_;
      *(undefined4 *)(puVar1 + -0x24) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._4_4_;
      *(undefined4 *)(puVar1 + -0x20) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._8_4_;
      *(undefined4 *)(puVar1 + -0x1c) = minItem.key.super_array<unsigned_char,_30UL>._M_elems._12_4_
      ;
      *puVar1 = 1;
      pSVar3 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (**(code **)(*(long *)((long)&(pSVar3->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                            ._vptr_OrderedStorage + lVar14) + 8))
                        ((long)&(pSVar3->
                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                ).
                                super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                .
                                super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                ._vptr_OrderedStorage + lVar14);
      lVar10 = lVar10 + lVar7;
    }
    lVar14 = lVar14 + 0x38;
    lVar15 = lVar15 + 0x30;
  }
  (*(this->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
    ._vptr_Cloneable[5])
            (&(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .register_,lVar10);
  updateOnce.currentFrontPointers = &currentFrontPointers;
  updateOnce.frontLine = &frontLine;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updateOnce.newer = newer;
  std::
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ::reserve(&writeBuffer,batchSize_local);
  dropWriteBuffer.batchSize = &batchSize_local;
  local_98 = __n & 0xffffffff;
  dropWriteBuffer.writeBuffer = &writeBuffer;
  dropWriteBuffer.this = this;
  while( true ) {
    local_130 = 0;
    bVar16 = false;
    for (uVar13 = local_98; i = (int)uVar13 - 1, -1 < (int)i; uVar13 = uVar13 - 1) {
      uVar11 = (ulong)i;
      uVar5 = local_130;
      if (frontLine.
          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar11].
          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
          _M_engaged == true) {
        uVar5 = uVar11;
        if (bVar16) {
          pKVar8 = std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>::value
                             (frontLine.
                              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar11);
          pKVar9 = std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>::value
                             (frontLine.
                              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_130);
          bVar6 = std::operator<((array<unsigned_char,_30UL> *)pKVar8,
                                 (array<unsigned_char,_30UL> *)pKVar9);
          if (!bVar6) {
            pKVar8 = std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>::value
                               (frontLine.
                                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11);
            pKVar9 = std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>::value
                               (frontLine.
                                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_130);
            bVar6 = std::operator==((array<unsigned_char,_30UL> *)pKVar8,
                                    (array<unsigned_char,_30UL> *)pKVar9);
            uVar5 = local_130;
            if (bVar6) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()(&updateOnce,i);
            }
          }
        }
        else {
          bVar16 = true;
        }
      }
      local_130 = uVar5;
    }
    if (!bVar16) break;
    pKVar8 = std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>::value
                       (frontLine.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_130);
    minItem.value = pKVar8->value;
    minItem.key.super_array<unsigned_char,_30UL>._M_elems._0_8_ =
         *(undefined8 *)(pKVar8->key).super_array<unsigned_char,_30UL>._M_elems;
    minItem.key.super_array<unsigned_char,_30UL>._M_elems._8_8_ =
         *(undefined8 *)((pKVar8->key).super_array<unsigned_char,_30UL>._M_elems + 8);
    minItem.key.super_array<unsigned_char,_30UL>._M_elems._16_8_ =
         *(undefined8 *)((pKVar8->key).super_array<unsigned_char,_30UL>._M_elems + 0x10);
    minItem._24_8_ = *(undefined8 *)((pKVar8->key).super_array<unsigned_char,_30UL>._M_elems + 0x18)
    ;
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
              (&updateOnce,(int32_t)local_130);
    std::
    vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>
    ::emplace_back<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>
              ((vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>
                *)&writeBuffer,&minItem);
    if (batchSize_local <=
        (ulong)(((long)writeBuffer.
                       super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)writeBuffer.
                      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
  std::
  _Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ::~_Vector_base(&writeBuffer.
                   super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                 );
  std::
  _Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  ::~_Vector_base(&frontLine.
                   super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                 );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&currentFrontPointers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }